

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O1

Vec_Int_t * Gia_AigerReadPacking(uchar **ppPos,int nSize)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  
  iVar5 = nSize + 3;
  if (-1 < nSize) {
    iVar5 = nSize;
  }
  iVar5 = iVar5 >> 2;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar9 = iVar5;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar9;
  if (iVar9 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar9 << 2);
  }
  pVVar2->pArray = piVar3;
  if ((nSize & 3U) != 0) {
    __assert_fail("nSize % 4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAigerExt.c"
                  ,0x132,"Vec_Int_t *Gia_AigerReadPacking(unsigned char **, int)");
  }
  if (3 < nSize) {
    lVar10 = (long)pVVar2->nSize;
    uVar6 = pVVar2->nCap;
    iVar9 = 0;
    do {
      lVar4 = 0;
      uVar8 = 0;
      do {
        uVar8 = (uint)(*ppPos)[lVar4] | uVar8 << 8;
        lVar4 = lVar4 + 1;
      } while ((int)lVar4 != 4);
      uVar1 = uVar6;
      if (uVar6 == (uint)lVar10) {
        if ((int)uVar6 < 0x10) {
          if (pVVar2->pArray == (int *)0x0) {
            piVar3 = (int *)malloc(0x40);
          }
          else {
            piVar3 = (int *)realloc(pVVar2->pArray,0x40);
          }
          pVVar2->pArray = piVar3;
          uVar7 = 0x10;
        }
        else {
          uVar7 = uVar6 * 2;
          if (SBORROW4(uVar6,uVar7) == 0 < (int)uVar6) goto LAB_001d535d;
          if (pVVar2->pArray == (int *)0x0) {
            piVar3 = (int *)malloc((ulong)uVar7 << 2);
          }
          else {
            piVar3 = (int *)realloc(pVVar2->pArray,(ulong)uVar7 << 2);
          }
          pVVar2->pArray = piVar3;
        }
        uVar1 = uVar7;
        if (piVar3 == (int *)0x0) {
          pVVar2->nSize = (uint)lVar10;
          pVVar2->nCap = uVar6;
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
      }
LAB_001d535d:
      uVar6 = uVar1;
      pVVar2->pArray[lVar10] = uVar8;
      lVar10 = lVar10 + 1;
      iVar9 = iVar9 + 1;
      *ppPos = *ppPos + 4;
    } while (iVar9 != iVar5);
    pVVar2->nSize = (int)lVar10;
    pVVar2->nCap = uVar6;
  }
  return pVVar2;
}

Assistant:

Vec_Int_t * Gia_AigerReadPacking( unsigned char ** ppPos, int nSize )
{
    Vec_Int_t * vPacking = Vec_IntAlloc( nSize/4 );
    int i;
    assert( nSize % 4 == 0 );
    for ( i = 0; i < nSize/4; i++, *ppPos += 4 )
        Vec_IntPush( vPacking, Gia_AigerReadInt( *ppPos ) );
    return vPacking;
}